

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindNormalProgramDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer path;
  pointer name;
  cmFindProgramHelper helper;
  allocator<char> local_181;
  pointer local_180;
  string local_178;
  undefined1 local_158 [296];
  
  std::__cxx11::string::string
            ((string *)&local_178,(string *)&(this->super_cmFindBase).FindCommandName);
  cmFindProgramHelper::cmFindProgramHelper
            ((cmFindProgramHelper *)local_158,&local_178,
             (this->super_cmFindBase).super_cmFindCommon.Makefile,&this->super_cmFindBase);
  std::__cxx11::string::~string((string *)&local_178);
  name = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_180 = (this->super_cmFindBase).Names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (name == local_180) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_181);
LAB_00230e40:
      cmFindProgramHelper::~cmFindProgramHelper((cmFindProgramHelper *)local_158);
      return __return_storage_ptr__;
    }
    cmFindProgramHelper::SetName((cmFindProgramHelper *)local_158,name);
    bVar2 = cmFindProgramHelper::CheckCompoundNames((cmFindProgramHelper *)local_158);
    if (bVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_158 + 0x18));
      goto LAB_00230e40;
    }
    path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (path != pbVar1) {
      bVar2 = cmFindProgramHelper::CheckDirectory((cmFindProgramHelper *)local_158,path);
      path = path + 1;
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_158 + 0x18));
        goto LAB_00230e40;
      }
    }
    name = name + 1;
  } while( true );
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramDirsPerName()
{
  // Search the entire path for each name.
  cmFindProgramHelper helper(this->FindCommandName, this->Makefile, this);
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Check for the names themselves if they contain a directory separator.
    if (helper.CheckCompoundNames()) {
      return helper.BestPath;
    }

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the program.
  return "";
}